

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O1

int Cnf_CountCnfSize(Aig_Man_t *p)

{
  void *pvVar1;
  Aig_Obj_t *pRoot;
  int iVar2;
  Vec_Ptr_t *vSuper;
  void **ppvVar3;
  Vec_Ptr_t *vNodes;
  Vec_Int_t *vCover;
  int *piVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  Aig_Man_t *p_00;
  uint uVar8;
  uint uVar9;
  
  vSuper = (Vec_Ptr_t *)malloc(0x10);
  vSuper->nCap = 100;
  vSuper->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vSuper->pArray = ppvVar3;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar4 = (int *)malloc(0x40000);
  vCover->pArray = piVar4;
  lVar5 = (long)p->vObjs->nSize;
  uVar9 = 0;
  uVar8 = 0;
  if (0 < lVar5) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar7];
      if (pvVar1 != (void *)0x0) {
        uVar8 = uVar8 + ((*(uint *)((long)pvVar1 + 0x18) >> 4 & 1) != 0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar5 != lVar7);
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    uVar9 = 0;
    do {
      pRoot = (Aig_Obj_t *)pVVar6->pArray[lVar5];
      if (((pRoot != (Aig_Obj_t *)0x0) && ((*(ulong *)&pRoot->field_0x18 & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)&pRoot->field_0x18 & 7) - 7)) {
        Cnf_CollectLeaves(pRoot,vSuper,0);
        p_00 = p;
        Cnf_CollectVolume(p,pRoot,vSuper,vNodes);
        if ((long)vNodes->nSize < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
        }
        if (pRoot != (Aig_Obj_t *)vNodes->pArray[(long)vNodes->nSize + -1]) {
          __assert_fail("pObj == Vec_PtrEntryLast(vNodes)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfFast.c"
                        ,0x205,"int Cnf_CountCnfSize(Aig_Man_t *)");
        }
        iVar2 = Cnf_CutCountClauses(p_00,vSuper,vNodes,vCover);
        uVar9 = uVar9 + iVar2;
      }
      lVar5 = lVar5 + 1;
      pVVar6 = p->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  printf("Vars = %d  Clauses = %d\n",(ulong)uVar8,(ulong)uVar9);
  if (vSuper->pArray != (void **)0x0) {
    free(vSuper->pArray);
    vSuper->pArray = (void **)0x0;
  }
  free(vSuper);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
    vCover->pArray = (int *)0x0;
  }
  free(vCover);
  return uVar9;
}

Assistant:

int Cnf_CountCnfSize( Aig_Man_t * p )
{
    Vec_Ptr_t * vLeaves, * vNodes;
    Vec_Int_t * vCover;
    Aig_Obj_t * pObj;
    int nVars = 0, nClauses = 0;
    int i, nSize;

    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vCover  = Vec_IntAlloc( 1 << 16 );

    Aig_ManForEachObj( p, pObj, i )
        nVars += pObj->fMarkA;

    Aig_ManForEachNode( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        Cnf_CollectLeaves( pObj, vLeaves, 0 );
        Cnf_CollectVolume( p, pObj, vLeaves, vNodes );
        assert( pObj == Vec_PtrEntryLast(vNodes) );

        nSize = Cnf_CutCountClauses( p, vLeaves, vNodes, vCover );
//        printf( "%d(%d) ", Vec_PtrSize(vLeaves), nSize );

        nClauses += nSize;
    }
//    printf( "\n" );
    printf( "Vars = %d  Clauses = %d\n", nVars, nClauses );

    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vCover );
    return nClauses;
}